

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

void CMU462::Collada::ColladaParser::parse_node(XMLElement *xml)

{
  char cVar1;
  double dVar2;
  bool bVar3;
  _Ios_Openmode _Var4;
  char *pcVar5;
  double *pdVar6;
  XMLElement *pXVar7;
  LightInfo *pLVar8;
  XMLElement *pXVar9;
  PolymeshInfo *this;
  XMLNode *this_00;
  MaterialInfo *this_01;
  MaterialInfo *material_1;
  XMLElement *local_ea0;
  XMLElement *e_material_1;
  string local_e90 [8];
  string material_id_1;
  string local_e68;
  XMLElement *local_e48;
  XMLElement *e_instance_material_1;
  SphereInfo *sphere;
  string local_e30;
  XMLNode *local_e10;
  MaterialInfo *material;
  XMLElement *local_de8;
  XMLElement *e_material;
  string local_dd8 [8];
  string material_id;
  string local_db0;
  XMLElement *local_d90;
  XMLElement *e_instance_material;
  PolymeshInfo *polymesh;
  string local_d78;
  LightInfo *local_d58;
  LightInfo *light;
  CameraInfo *camera;
  string local_d40;
  XMLElement *local_d20;
  XMLElement *e_geometry;
  string local_d10;
  XMLElement *local_cf0;
  XMLElement *e_light;
  string local_ce0;
  XMLElement *local_cc0;
  XMLElement *e_camera;
  string local_cb0;
  XMLElement *local_c90;
  XMLElement *e_child;
  double dStack_c80;
  double local_c78;
  double dStack_c70;
  double local_c68;
  double dStack_c60;
  double local_c58;
  double dStack_c50;
  double local_c48;
  double dStack_c40;
  double local_c38;
  double dStack_c30;
  double local_c28;
  double dStack_c20;
  double local_c18;
  double dStack_c10;
  undefined1 auStack_c08 [8];
  Matrix4x4 transform_save;
  stringstream local_b08 [8];
  stringstream ss_3;
  allocator<char> local_979;
  string local_978 [8];
  string s_3;
  Matrix4x4 m_2;
  stringstream local_858 [8];
  stringstream ss_2;
  allocator<char> local_6c9;
  string local_6c8 [8];
  string s_2;
  Matrix4x4 m_1;
  allocator<char> local_5a1;
  string local_5a0 [8];
  string sid;
  stringstream ss_1;
  allocator<char> local_3f1;
  string local_3f0 [8];
  string s_1;
  Matrix4x4 m;
  undefined1 local_348 [8];
  Matrix4x4 mat;
  stringstream ss;
  allocator<char> local_139;
  string local_138 [8];
  string s;
  undefined1 local_110 [8];
  string name;
  XMLElement *e;
  undefined1 local_d8 [8];
  Node node;
  XMLElement *xml_local;
  
  node.transform.entries[3].w = (double)xml;
  Node::Node((Node *)local_d8);
  pcVar5 = tinyxml2::XMLElement::Attribute
                     ((XMLElement *)node.transform.entries[3].w,"id",(char *)0x0);
  std::__cxx11::string::operator=((string *)local_d8,pcVar5);
  pcVar5 = tinyxml2::XMLElement::Attribute
                     ((XMLElement *)node.transform.entries[3].w,"name",(char *)0x0);
  std::__cxx11::string::operator=((string *)(node.id.field_2._M_local_buf + 8),pcVar5);
  name.field_2._8_8_ =
       tinyxml2::XMLNode::FirstChildElement((XMLNode *)node.transform.entries[3].w,(char *)0x0);
  do {
    if (name.field_2._8_8_ == 0) break;
    pcVar5 = tinyxml2::XMLElement::Name((XMLElement *)name.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_110,pcVar5,(allocator<char> *)(s.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(s.field_2._M_local_buf + 0xf));
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_110,"matrix");
    if (bVar3) {
      pcVar5 = tinyxml2::XMLElement::GetText((XMLElement *)name.field_2._8_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_138,pcVar5,&local_139);
      std::allocator<char>::~allocator(&local_139);
      _Var4 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream((stringstream *)&mat.entries[3].w,local_138,_Var4);
      Matrix4x4::Matrix4x4((Matrix4x4 *)local_348);
      pdVar6 = Matrix4x4::operator()((Matrix4x4 *)local_348,0,0);
      std::istream::operator>>((istream *)&mat.entries[3].w,pdVar6);
      pdVar6 = Matrix4x4::operator()((Matrix4x4 *)local_348,0,1);
      std::istream::operator>>((istream *)&mat.entries[3].w,pdVar6);
      pdVar6 = Matrix4x4::operator()((Matrix4x4 *)local_348,0,2);
      std::istream::operator>>((istream *)&mat.entries[3].w,pdVar6);
      pdVar6 = Matrix4x4::operator()((Matrix4x4 *)local_348,0,3);
      std::istream::operator>>((istream *)&mat.entries[3].w,pdVar6);
      pdVar6 = Matrix4x4::operator()((Matrix4x4 *)local_348,1,0);
      std::istream::operator>>((istream *)&mat.entries[3].w,pdVar6);
      pdVar6 = Matrix4x4::operator()((Matrix4x4 *)local_348,1,1);
      std::istream::operator>>((istream *)&mat.entries[3].w,pdVar6);
      pdVar6 = Matrix4x4::operator()((Matrix4x4 *)local_348,1,2);
      std::istream::operator>>((istream *)&mat.entries[3].w,pdVar6);
      pdVar6 = Matrix4x4::operator()((Matrix4x4 *)local_348,1,3);
      std::istream::operator>>((istream *)&mat.entries[3].w,pdVar6);
      pdVar6 = Matrix4x4::operator()((Matrix4x4 *)local_348,2,0);
      std::istream::operator>>((istream *)&mat.entries[3].w,pdVar6);
      pdVar6 = Matrix4x4::operator()((Matrix4x4 *)local_348,2,1);
      std::istream::operator>>((istream *)&mat.entries[3].w,pdVar6);
      pdVar6 = Matrix4x4::operator()((Matrix4x4 *)local_348,2,2);
      std::istream::operator>>((istream *)&mat.entries[3].w,pdVar6);
      pdVar6 = Matrix4x4::operator()((Matrix4x4 *)local_348,2,3);
      std::istream::operator>>((istream *)&mat.entries[3].w,pdVar6);
      pdVar6 = Matrix4x4::operator()((Matrix4x4 *)local_348,3,0);
      std::istream::operator>>((istream *)&mat.entries[3].w,pdVar6);
      pdVar6 = Matrix4x4::operator()((Matrix4x4 *)local_348,3,1);
      std::istream::operator>>((istream *)&mat.entries[3].w,pdVar6);
      pdVar6 = Matrix4x4::operator()((Matrix4x4 *)local_348,3,2);
      std::istream::operator>>((istream *)&mat.entries[3].w,pdVar6);
      pdVar6 = Matrix4x4::operator()((Matrix4x4 *)local_348,3,3);
      std::istream::operator>>((istream *)&mat.entries[3].w,pdVar6);
      memcpy(&node.instance,local_348,0x80);
      m.entries[3].w._4_4_ = 3;
      std::__cxx11::stringstream::~stringstream((stringstream *)&mat.entries[3].w);
      std::__cxx11::string::~string(local_138);
    }
    else {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_110,"rotate");
      if (bVar3) {
        Matrix4x4::Matrix4x4((Matrix4x4 *)((long)&s_1.field_2 + 8));
        pcVar5 = tinyxml2::XMLElement::GetText((XMLElement *)name.field_2._8_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_3f0,pcVar5,&local_3f1);
        std::allocator<char>::~allocator(&local_3f1);
        _Var4 = std::operator|(_S_out,_S_in);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)(sid.field_2._M_local_buf + 8),local_3f0,_Var4);
        pcVar5 = tinyxml2::XMLElement::Attribute((XMLElement *)name.field_2._8_8_,"sid",(char *)0x0)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_5a0,pcVar5,&local_5a1);
        std::allocator<char>::~allocator(&local_5a1);
        pcVar5 = (char *)std::__cxx11::string::back();
        cVar1 = *pcVar5;
        if (cVar1 == 'X') {
          pdVar6 = Matrix4x4::operator()((Matrix4x4 *)((long)&s_1.field_2 + 8),1,1);
          std::istream::operator>>((istream *)(sid.field_2._M_local_buf + 8),pdVar6);
          pdVar6 = Matrix4x4::operator()((Matrix4x4 *)((long)&s_1.field_2 + 8),1,2);
          std::istream::operator>>((istream *)(sid.field_2._M_local_buf + 8),pdVar6);
          pdVar6 = Matrix4x4::operator()((Matrix4x4 *)((long)&s_1.field_2 + 8),2,1);
          std::istream::operator>>((istream *)(sid.field_2._M_local_buf + 8),pdVar6);
          pdVar6 = Matrix4x4::operator()((Matrix4x4 *)((long)&s_1.field_2 + 8),2,2);
          std::istream::operator>>((istream *)(sid.field_2._M_local_buf + 8),pdVar6);
        }
        else if (cVar1 == 'Y') {
          pdVar6 = Matrix4x4::operator()((Matrix4x4 *)((long)&s_1.field_2 + 8),0,0);
          std::istream::operator>>((istream *)(sid.field_2._M_local_buf + 8),pdVar6);
          pdVar6 = Matrix4x4::operator()((Matrix4x4 *)((long)&s_1.field_2 + 8),2,0);
          std::istream::operator>>((istream *)(sid.field_2._M_local_buf + 8),pdVar6);
          pdVar6 = Matrix4x4::operator()((Matrix4x4 *)((long)&s_1.field_2 + 8),0,2);
          std::istream::operator>>((istream *)(sid.field_2._M_local_buf + 8),pdVar6);
          pdVar6 = Matrix4x4::operator()((Matrix4x4 *)((long)&s_1.field_2 + 8),2,2);
          std::istream::operator>>((istream *)(sid.field_2._M_local_buf + 8),pdVar6);
        }
        else if (cVar1 == 'Z') {
          pdVar6 = Matrix4x4::operator()((Matrix4x4 *)((long)&s_1.field_2 + 8),0,0);
          std::istream::operator>>((istream *)(sid.field_2._M_local_buf + 8),pdVar6);
          pdVar6 = Matrix4x4::operator()((Matrix4x4 *)((long)&s_1.field_2 + 8),0,1);
          std::istream::operator>>((istream *)(sid.field_2._M_local_buf + 8),pdVar6);
          pdVar6 = Matrix4x4::operator()((Matrix4x4 *)((long)&s_1.field_2 + 8),1,0);
          std::istream::operator>>((istream *)(sid.field_2._M_local_buf + 8),pdVar6);
          pdVar6 = Matrix4x4::operator()((Matrix4x4 *)((long)&s_1.field_2 + 8),1,1);
          std::istream::operator>>((istream *)(sid.field_2._M_local_buf + 8),pdVar6);
        }
        Matrix4x4::operator*
                  ((Matrix4x4 *)&m_1.entries[3].w,(Matrix4x4 *)((long)&s_1.field_2 + 8),
                   (Matrix4x4 *)&node.instance);
        memcpy(&node.instance,&m_1.entries[3].w,0x80);
        std::__cxx11::string::~string(local_5a0);
        std::__cxx11::stringstream::~stringstream((stringstream *)(sid.field_2._M_local_buf + 8));
        std::__cxx11::string::~string(local_3f0);
      }
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_110,"translate");
      if (bVar3) {
        Matrix4x4::Matrix4x4((Matrix4x4 *)((long)&s_2.field_2 + 8));
        pcVar5 = tinyxml2::XMLElement::GetText((XMLElement *)name.field_2._8_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_6c8,pcVar5,&local_6c9);
        std::allocator<char>::~allocator(&local_6c9);
        _Var4 = std::operator|(_S_out,_S_in);
        std::__cxx11::stringstream::stringstream(local_858,local_6c8,_Var4);
        pdVar6 = Matrix4x4::operator()((Matrix4x4 *)((long)&s_2.field_2 + 8),0,3);
        std::istream::operator>>((istream *)local_858,pdVar6);
        pdVar6 = Matrix4x4::operator()((Matrix4x4 *)((long)&s_2.field_2 + 8),1,3);
        std::istream::operator>>((istream *)local_858,pdVar6);
        pdVar6 = Matrix4x4::operator()((Matrix4x4 *)((long)&s_2.field_2 + 8),2,3);
        std::istream::operator>>((istream *)local_858,pdVar6);
        Matrix4x4::operator*
                  ((Matrix4x4 *)&m_2.entries[3].w,(Matrix4x4 *)((long)&s_2.field_2 + 8),
                   (Matrix4x4 *)&node.instance);
        memcpy(&node.instance,&m_2.entries[3].w,0x80);
        std::__cxx11::stringstream::~stringstream(local_858);
        std::__cxx11::string::~string(local_6c8);
      }
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_110,"scale");
      if (bVar3) {
        Matrix4x4::Matrix4x4((Matrix4x4 *)((long)&s_3.field_2 + 8));
        pcVar5 = tinyxml2::XMLElement::GetText((XMLElement *)name.field_2._8_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_978,pcVar5,&local_979);
        std::allocator<char>::~allocator(&local_979);
        _Var4 = std::operator|(_S_out,_S_in);
        std::__cxx11::stringstream::stringstream(local_b08,local_978,_Var4);
        pdVar6 = Matrix4x4::operator()((Matrix4x4 *)((long)&s_3.field_2 + 8),0,0);
        std::istream::operator>>((istream *)local_b08,pdVar6);
        pdVar6 = Matrix4x4::operator()((Matrix4x4 *)((long)&s_3.field_2 + 8),1,1);
        std::istream::operator>>((istream *)local_b08,pdVar6);
        pdVar6 = Matrix4x4::operator()((Matrix4x4 *)((long)&s_3.field_2 + 8),1,1);
        std::istream::operator>>((istream *)local_b08,pdVar6);
        Matrix4x4::operator*
                  ((Matrix4x4 *)&transform_save.entries[3].w,(Matrix4x4 *)((long)&s_3.field_2 + 8),
                   (Matrix4x4 *)&node.instance);
        memcpy(&node.instance,&transform_save.entries[3].w,0x80);
        std::__cxx11::stringstream::~stringstream(local_b08);
        std::__cxx11::string::~string(local_978);
      }
      name.field_2._8_8_ =
           (size_type)tinyxml2::XMLNode::NextSiblingElement(name.field_2._8_8_,(char *)0x0);
      m.entries[3].w._4_4_ = 0;
    }
    std::__cxx11::string::~string((string *)local_110);
  } while (m.entries[3].w._4_4_ == 0);
  Matrix4x4::Matrix4x4((Matrix4x4 *)auStack_c08,(Matrix4x4 *)transform);
  Matrix4x4::operator*((Matrix4x4 *)&e_child,(Matrix4x4 *)transform,(Matrix4x4 *)&node.instance);
  dVar2 = node.transform.entries[3].w;
  node.transform.entries[3].y = local_c18;
  node.transform.entries[3].z = dStack_c10;
  node.transform.entries[2].w = local_c28;
  node.transform.entries[3].x = dStack_c20;
  node.transform.entries[2].y = local_c38;
  node.transform.entries[2].z = dStack_c30;
  node.transform.entries[1].w = local_c48;
  node.transform.entries[2].x = dStack_c40;
  node.transform.entries[1].y = local_c58;
  node.transform.entries[1].z = dStack_c50;
  node.transform.entries[0].w = local_c68;
  node.transform.entries[1].x = dStack_c60;
  node.transform.entries[0].y = local_c78;
  node.transform.entries[0].z = dStack_c70;
  node.instance = (Instance *)e_child;
  node.transform.entries[0].x = dStack_c80;
  transform._112_8_ = local_c18;
  transform._120_8_ = dStack_c10;
  transform._96_8_ = local_c28;
  transform._104_8_ = dStack_c20;
  transform._80_8_ = local_c38;
  transform._88_8_ = dStack_c30;
  transform._64_8_ = local_c48;
  transform._72_8_ = dStack_c40;
  transform._48_8_ = local_c58;
  transform._56_8_ = dStack_c50;
  transform._32_8_ = local_c68;
  transform._40_8_ = dStack_c60;
  transform._16_8_ = local_c78;
  transform._24_8_ = dStack_c70;
  transform._0_8_ = e_child;
  transform._8_8_ = dStack_c80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_cb0,"node",(allocator<char> *)((long)&e_camera + 7));
  pXVar7 = get_element((XMLElement *)dVar2,&local_cb0);
  std::__cxx11::string::~string((string *)&local_cb0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_camera + 7));
  for (local_c90 = pXVar7; dVar2 = node.transform.entries[3].w, local_c90 != (XMLElement *)0x0;
      local_c90 = tinyxml2::XMLNode::NextSiblingElement(&local_c90->super_XMLNode,"node")) {
    parse_node(local_c90);
  }
  transform._112_8_ = transform_save.entries[3].y;
  transform._120_8_ = transform_save.entries[3].z;
  transform._96_8_ = transform_save.entries[2].w;
  transform._104_8_ = transform_save.entries[3].x;
  transform._80_8_ = transform_save.entries[2].y;
  transform._88_8_ = transform_save.entries[2].z;
  transform._64_8_ = transform_save.entries[1].w;
  transform._72_8_ = transform_save.entries[2].x;
  transform._48_8_ = transform_save.entries[1].y;
  transform._56_8_ = transform_save.entries[1].z;
  transform._32_8_ = transform_save.entries[0].w;
  transform._40_8_ = transform_save.entries[1].x;
  transform._16_8_ = transform_save.entries[0].y;
  transform._24_8_ = transform_save.entries[0].z;
  transform._0_8_ = auStack_c08;
  transform._8_8_ = transform_save.entries[0].x;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ce0,"instance_camera",(allocator<char> *)((long)&e_light + 7));
  pXVar7 = get_element((XMLElement *)dVar2,&local_ce0);
  std::__cxx11::string::~string((string *)&local_ce0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_light + 7));
  dVar2 = node.transform.entries[3].w;
  local_cc0 = pXVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d10,"instance_light",(allocator<char> *)((long)&e_geometry + 7));
  pXVar7 = get_element((XMLElement *)dVar2,&local_d10);
  std::__cxx11::string::~string((string *)&local_d10);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_geometry + 7));
  dVar2 = node.transform.entries[3].w;
  local_cf0 = pXVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d40,"instance_geometry",(allocator<char> *)((long)&camera + 7));
  pXVar7 = get_element((XMLElement *)dVar2,&local_d40);
  std::__cxx11::string::~string((string *)&local_d40);
  std::allocator<char>::~allocator((allocator<char> *)((long)&camera + 7));
  local_d20 = pXVar7;
  if (local_cc0 == (XMLElement *)0x0) {
    if (local_cf0 == (XMLElement *)0x0) {
      if (pXVar7 != (XMLElement *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d78,"mesh",(allocator<char> *)((long)&polymesh + 7));
        pXVar9 = get_element(pXVar7,&local_d78);
        std::__cxx11::string::~string((string *)&local_d78);
        std::allocator<char>::~allocator((allocator<char> *)((long)&polymesh + 7));
        pXVar7 = local_d20;
        if (pXVar9 == (XMLElement *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e30,"extra",(allocator<char> *)((long)&sphere + 7));
          pXVar7 = get_element(pXVar7,&local_e30);
          std::__cxx11::string::~string((string *)&local_e30);
          std::allocator<char>::~allocator((allocator<char> *)((long)&sphere + 7));
          if (pXVar7 != (XMLElement *)0x0) {
            pXVar7 = (XMLElement *)operator_new(0x58);
            (pXVar7->super_XMLNode)._prev = (XMLNode *)0x0;
            (pXVar7->super_XMLNode)._next = (XMLNode *)0x0;
            (pXVar7->super_XMLNode)._firstChild = (XMLNode *)0x0;
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
              *)&(pXVar7->super_XMLNode)._lastChild)->_M_allocated_capacity = 0;
            *(undefined8 *)((long)&(pXVar7->super_XMLNode)._value + 8) = 0;
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
              *)&(pXVar7->super_XMLNode)._value)[1]._M_allocated_capacity = 0;
            (pXVar7->super_XMLNode)._parent = (XMLNode *)0x0;
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
              *)&(pXVar7->super_XMLNode)._value)->_M_allocated_capacity = 0;
            (pXVar7->super_XMLNode)._vptr_XMLNode = (_func_int **)0x0;
            *(undefined8 *)&(pXVar7->super_XMLNode)._document = 0;
            (pXVar7->super_XMLNode)._memPool = (MemPool *)0x0;
            SphereInfo::SphereInfo((SphereInfo *)pXVar7);
            e_instance_material_1 = pXVar7;
            parse_sphere(local_d20,(SphereInfo *)pXVar7);
            dVar2 = node.transform.entries[3].w;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_e68,
                       "instance_geometry/bind_material/technique_common/instance_material",
                       (allocator<char> *)(material_id_1.field_2._M_local_buf + 0xf));
            pXVar7 = get_element((XMLElement *)dVar2,&local_e68);
            std::__cxx11::string::~string((string *)&local_e68);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(material_id_1.field_2._M_local_buf + 0xf));
            local_e48 = pXVar7;
            if (pXVar7 != (XMLElement *)0x0) {
              pcVar5 = tinyxml2::XMLElement::Attribute(pXVar7,"target",(char *)0x0);
              if (pcVar5 == (char *)0x0) {
                exit(1);
              }
              pcVar5 = tinyxml2::XMLElement::Attribute(local_e48,"target",(char *)0x0);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (local_e90,pcVar5 + 1,(allocator<char> *)((long)&e_material_1 + 7));
              std::allocator<char>::~allocator((allocator<char> *)((long)&e_material_1 + 7));
              std::__cxx11::string::string((string *)&material_1,local_e90);
              pXVar7 = uri_find((string *)&material_1);
              std::__cxx11::string::~string((string *)&material_1);
              local_ea0 = pXVar7;
              if (pXVar7 == (XMLElement *)0x0) {
                exit(1);
              }
              this_01 = (MaterialInfo *)operator_new(0x50);
              *(undefined8 *)((long)&(this_01->super_Instance).name.field_2 + 8) = 0;
              this_01->bsdf = (BSDF *)0x0;
              (this_01->super_Instance).name._M_string_length = 0;
              (this_01->super_Instance).name.field_2._M_allocated_capacity = 0;
              *(undefined8 *)((long)&(this_01->super_Instance).id.field_2 + 8) = 0;
              *(undefined8 *)&(this_01->super_Instance).name = 0;
              (this_01->super_Instance).id._M_string_length = 0;
              (this_01->super_Instance).id.field_2._M_allocated_capacity = 0;
              *(undefined8 *)&this_01->super_Instance = 0;
              *(undefined8 *)&(this_01->super_Instance).id = 0;
              MaterialInfo::MaterialInfo(this_01);
              parse_material(local_ea0,this_01);
              (e_instance_material_1->super_XMLNode)._memPool = (MemPool *)this_01;
              std::__cxx11::string::~string(local_e90);
            }
            node.name.field_2._8_8_ = e_instance_material_1;
          }
        }
        else {
          this = (PolymeshInfo *)operator_new(0xb0);
          (this->polygons).
          super__Vector_base<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          this->material = (MaterialInfo *)0x0;
          (this->polygons).
          super__Vector_base<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (this->polygons).
          super__Vector_base<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (this->texcoords).super__Vector_base<CMU462::Vector2D,_std::allocator<CMU462::Vector2D>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (this->texcoords).super__Vector_base<CMU462::Vector2D,_std::allocator<CMU462::Vector2D>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (this->normals).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (this->texcoords).super__Vector_base<CMU462::Vector2D,_std::allocator<CMU462::Vector2D>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (this->normals).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (this->normals).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (this->vertices).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (this->vertices).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          *(undefined8 *)((long)&(this->super_Instance).name.field_2 + 8) = 0;
          (this->vertices).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (this->super_Instance).name._M_string_length = 0;
          (this->super_Instance).name.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(this->super_Instance).id.field_2 + 8) = 0;
          *(undefined8 *)&(this->super_Instance).name = 0;
          (this->super_Instance).id._M_string_length = 0;
          (this->super_Instance).id.field_2._M_allocated_capacity = 0;
          *(undefined8 *)&this->super_Instance = 0;
          *(undefined8 *)&(this->super_Instance).id = 0;
          PolymeshInfo::PolymeshInfo(this);
          e_instance_material = (XMLElement *)this;
          parse_polymesh(local_d20,this);
          dVar2 = node.transform.entries[3].w;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_db0,
                     "instance_geometry/bind_material/technique_common/instance_material",
                     (allocator<char> *)(material_id.field_2._M_local_buf + 0xf));
          pXVar7 = get_element((XMLElement *)dVar2,&local_db0);
          std::__cxx11::string::~string((string *)&local_db0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(material_id.field_2._M_local_buf + 0xf));
          local_d90 = pXVar7;
          if (pXVar7 != (XMLElement *)0x0) {
            pcVar5 = tinyxml2::XMLElement::Attribute(pXVar7,"target",(char *)0x0);
            if (pcVar5 == (char *)0x0) {
              exit(1);
            }
            pcVar5 = tinyxml2::XMLElement::Attribute(local_d90,"target",(char *)0x0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_dd8,pcVar5 + 1,(allocator<char> *)((long)&e_material + 7));
            std::allocator<char>::~allocator((allocator<char> *)((long)&e_material + 7));
            std::__cxx11::string::string((string *)&material,local_dd8);
            pXVar7 = uri_find((string *)&material);
            std::__cxx11::string::~string((string *)&material);
            local_de8 = pXVar7;
            if (pXVar7 == (XMLElement *)0x0) {
              exit(1);
            }
            this_00 = (XMLNode *)operator_new(0x50);
            this_00->_prev = (XMLNode *)0x0;
            this_00->_next = (XMLNode *)0x0;
            this_00->_firstChild = (XMLNode *)0x0;
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
              *)&this_00->_lastChild)->_M_allocated_capacity = 0;
            *(undefined8 *)((long)&this_00->_value + 8) = 0;
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
              *)&this_00->_value)[1]._M_allocated_capacity = 0;
            this_00->_parent = (XMLNode *)0x0;
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
              *)&this_00->_value)->_M_allocated_capacity = 0;
            *(undefined8 *)&this_00->_vptr_XMLNode = 0;
            *(undefined8 *)&this_00->_document = 0;
            MaterialInfo::MaterialInfo((MaterialInfo *)this_00);
            local_e10 = this_00;
            parse_material(local_de8,(MaterialInfo *)this_00);
            e_instance_material[1].super_XMLNode._prev = local_e10;
            std::__cxx11::string::~string(local_dd8);
          }
          node.name.field_2._8_8_ = e_instance_material;
        }
      }
    }
    else {
      pLVar8 = (LightInfo *)operator_new(0xb8);
      LightInfo::LightInfo(pLVar8);
      local_d58 = pLVar8;
      parse_light(local_cf0,pLVar8);
      node.name.field_2._8_8_ = local_d58;
    }
  }
  else {
    pLVar8 = (LightInfo *)operator_new(0x88);
    (pLVar8->direction).x = 0.0;
    (pLVar8->direction).y = 0.0;
    (pLVar8->position).y = 0.0;
    (pLVar8->position).z = 0.0;
    *(double *)&(pLVar8->spectrum).g = 0.0;
    (pLVar8->position).x = 0.0;
    *(undefined8 *)((long)&(pLVar8->super_Instance).name.field_2 + 8) = 0;
    ((Vector3D *)&pLVar8->light_type)->x = 0.0;
    (pLVar8->super_Instance).name._M_string_length = 0;
    (pLVar8->super_Instance).name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pLVar8->super_Instance).id.field_2 + 8) = 0;
    *(undefined8 *)&(pLVar8->super_Instance).name = 0;
    (pLVar8->super_Instance).id._M_string_length = 0;
    (pLVar8->super_Instance).id.field_2._M_allocated_capacity = 0;
    *(undefined8 *)&pLVar8->super_Instance = 0;
    *(undefined8 *)&(pLVar8->super_Instance).id = 0;
    (pLVar8->direction).z = 0.0;
    CameraInfo::CameraInfo((CameraInfo *)pLVar8);
    light = pLVar8;
    parse_camera(local_cc0,(CameraInfo *)pLVar8);
    node.name.field_2._8_8_ = light;
  }
  std::vector<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_>::push_back
            (scene,(value_type *)local_d8);
  Node::~Node((Node *)local_d8);
  return;
}

Assistant:

void ColladaParser::parse_node( XMLElement* xml ) {

	// create new node
	Node node = Node();

  // name & id
  node.id   = xml->Attribute( "id" );
  node.name = xml->Attribute("name");
  stat(" |- Node: " << node.name << " (id:" << node.id << ")");

	// node transformation -
  // combine in order of declaration if the transformations are given as a
  // transformation list
  XMLElement* e = xml->FirstChildElement();
  while (e) {

    string name = e->Name();

    // transformation - matrix
    if (name == "matrix") {

      string s = e->GetText();
      stringstream ss (s);

      Matrix4x4 mat;
      ss >> mat(0,0); ss >> mat(0,1); ss >> mat(0,2); ss >> mat(0,3);
      ss >> mat(1,0); ss >> mat(1,1); ss >> mat(1,2); ss >> mat(1,3);
      ss >> mat(2,0); ss >> mat(2,1); ss >> mat(2,2); ss >> mat(2,3);
      ss >> mat(3,0); ss >> mat(3,1); ss >> mat(3,2); ss >> mat(3,3);

      node.transform = mat; break;

    }

    // transformation - rotate
    if (name == "rotate") {

      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss (s);

      string sid = e->Attribute("sid");
      switch (sid.back()) {
        case 'X':
          ss >> m(1,1); ss >> m(1,2);
          ss >> m(2,1); ss >> m(2,2);
          break;
        case 'Y':
          ss >> m(0,0); ss >> m(2,0);
          ss >> m(0,2); ss >> m(2,2);
          break;
        case 'Z':
          ss >> m(0,0); ss >> m(0,1);
          ss >> m(1,0); ss >> m(1,1);
          break;
        default:
          break;
      }

      node.transform = m * node.transform;

    }

    // transformation - translate
    if (name == "translate") {

      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss (s);

      ss >> m(0,3); ss >> m(1,3); ss >> m(2,3);

      node.transform = m * node.transform;
    }

    // transformation - scale
    if (name == "scale") {

      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss (s);

      ss >> m(0,0); ss >> m(1,1); ss >> m(1,1);

      node.transform = m * node.transform;
    }

    // transformation - skew
    // Note (sky): ignored for now

    // transformation - lookat
    // Note (sky): ignored for now

    e = e->NextSiblingElement();
  }

	// push transformations
	Matrix4x4 transform_save = transform;

	// combine transformations
	node.transform = transform * node.transform;
	transform = node.transform;

	// parse child nodes if node is a joint
	XMLElement* e_child = get_element(xml, "node");
	while (e_child) {
		parse_node(e_child);
		e_child = e_child->NextSiblingElement("node");
	}

	// pop transformations
	transform = transform_save;

  // node instance -
  // non-joint nodes must contain a scene object instance
  XMLElement* e_camera   = get_element(xml, "instance_camera");
  XMLElement* e_light    = get_element(xml, "instance_light");
	XMLElement* e_geometry = get_element(xml, "instance_geometry");

  if (e_camera) {
    CameraInfo* camera = new CameraInfo();
    parse_camera( e_camera, *camera );
    node.instance = camera;
  } else if (e_light) {
    LightInfo* light = new LightInfo();
    parse_light( e_light, *light );
    node.instance = light;
  } else if (e_geometry) {
		if (get_element(e_geometry, "mesh")) {

			// mesh geometry
			PolymeshInfo* polymesh = new PolymeshInfo();
			parse_polymesh(e_geometry, *polymesh);

			// mesh material
			XMLElement* e_instance_material = get_element(xml,
			"instance_geometry/bind_material/technique_common/instance_material");
			if (e_instance_material) {

				if (!e_instance_material->Attribute("target")) {
					stat("Error: no target material in instance: " << e_instance_material);
					exit(EXIT_FAILURE);
				}

				string material_id = e_instance_material->Attribute("target") + 1;
				XMLElement* e_material = uri_find(material_id);
				if (!e_material) {
					stat("Error: invalid target material id : " << material_id);
					exit(EXIT_FAILURE);
				}

				MaterialInfo* material = new MaterialInfo();
				parse_material(e_material, *material);
				polymesh->material = material;
			}

			node.instance = polymesh;

		} else if (get_element(e_geometry, "extra")) {

			// sphere geometry
			SphereInfo* sphere = new SphereInfo();
			parse_sphere(e_geometry, *sphere);

			// sphere material
			XMLElement* e_instance_material = get_element(xml,
			"instance_geometry/bind_material/technique_common/instance_material");
			if (e_instance_material) {

				if (!e_instance_material->Attribute("target")) {
					stat("Error: no target material in instance: " << e_instance_material);
					exit(EXIT_FAILURE);
				}

				string material_id = e_instance_material->Attribute("target") + 1;
				XMLElement* e_material = uri_find(material_id);
				if (!e_material) {
					stat("Error: invalid target material id : " << material_id);
					exit(EXIT_FAILURE);
				}

				MaterialInfo* material = new MaterialInfo();
				parse_material(e_material, *material);
				sphere->material = material;
			}

			node.instance = sphere;

		}
  }

	// add node to scene
	scene->nodes.push_back(node);
}